

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase135::run(TestCase135 *this)

{
  anon_union_1_1_a8c68091_for_NullableValue<char>_2 *params_2;
  Maybe<char> result;
  Input input;
  Maybe<char> result_3;
  CharGroup_ parser;
  
  parser.bits[2] = 0;
  parser.bits[3] = 0;
  parser.bits[0] = 0x4000000000000;
  parser.bits[1] = 0x100400200000004;
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "a";
  input.end = "";
  input.best = "a";
  CharGroup_::operator()((CharGroup_ *)&result,(IteratorInput<char,_const_char_*> *)&parser);
  params_2 = &result.ptr.field_1;
  if (result.ptr.isSet == true) {
    if ((result.ptr.field_1.value != 'a') && (kj::_::Debug::minSeverity < 3)) {
      result_3.ptr.isSet = true;
      kj::_::Debug::log<char_const(&)[35],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x8f,ERROR,"\"failed: expected \" \"(\'a\') == (*value)\", \'a\', *value",
                 (char (*) [35])"failed: expected (\'a\') == (*value)",(char *)&result_3,
                 &params_2->value);
    }
  }
  else {
    result_3.ptr.isSet = false;
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&result_3,(char (*) [33])"Expected parse result, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&result_3);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x93,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "n";
  input.end = "";
  input.best = "n";
  CharGroup_::operator()((CharGroup_ *)&result,(IteratorInput<char,_const_char_*> *)&parser);
  if (result.ptr.isSet == true) {
    if ((result.ptr.field_1.value != 'n') && (kj::_::Debug::minSeverity < 3)) {
      result_3.ptr.isSet = true;
      kj::_::Debug::log<char_const(&)[35],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0x9b,ERROR,"\"failed: expected \" \"(\'n\') == (*value)\", \'n\', *value",
                 (char (*) [35])"failed: expected (\'n\') == (*value)",(char *)&result_3,
                 &params_2->value);
    }
  }
  else {
    result_3.ptr.isSet = false;
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&result_3,(char (*) [33])"Expected parse result, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&result_3);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0x9f,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "B";
  input.end = "";
  input.best = "B";
  CharGroup_::operator()((CharGroup_ *)&result,(IteratorInput<char,_const_char_*> *)&parser);
  if (result.ptr.isSet == true) {
    if ((result.ptr.field_1.value != 'B') && (kj::_::Debug::minSeverity < 3)) {
      result_3.ptr.isSet = true;
      kj::_::Debug::log<char_const(&)[35],char,char&>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
                 ,0xa7,ERROR,"\"failed: expected \" \"(\'B\') == (*value)\", \'B\', *value",
                 (char (*) [35])"failed: expected (\'B\') == (*value)",(char *)&result_3,
                 &params_2->value);
    }
  }
  else {
    result_3.ptr.isSet = false;
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)&result_3,(char (*) [33])"Expected parse result, got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)&result_3);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0xab,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "b";
  input.end = "";
  input.best = "b";
  CharGroup_::operator()((CharGroup_ *)&result_3,(IteratorInput<char,_const_char_*> *)&parser);
  if ((result_3.ptr.isSet & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0xb2,ERROR,"\"failed: expected \" \"result == nullptr\"",
               (char (*) [35])"failed: expected result == nullptr");
  }
  if ((input.pos == input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0xb3,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
               (char (*) [34])"failed: expected !(input.atEnd())");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "j";
  input.end = "";
  input.best = "j";
  CharGroup_::operator()((CharGroup_ *)&result_3,(IteratorInput<char,_const_char_*> *)&parser);
  if ((result_3.ptr.isSet & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0xba,ERROR,"\"failed: expected \" \"result == nullptr\"",
               (char (*) [35])"failed: expected result == nullptr");
  }
  if ((input.pos == input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0xbb,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
               (char (*) [34])"failed: expected !(input.atEnd())");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "A";
  input.end = "";
  input.best = "A";
  CharGroup_::operator()((CharGroup_ *)&result_3,(IteratorInput<char,_const_char_*> *)&parser);
  if ((result_3.ptr.isSet & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0xc2,ERROR,"\"failed: expected \" \"result == nullptr\"",
               (char (*) [35])"failed: expected result == nullptr");
  }
  if ((input.pos == input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[34]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char-test.c++"
               ,0xc3,ERROR,"\"failed: expected \" \"!(input.atEnd())\"",
               (char (*) [34])"failed: expected !(input.atEnd())");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  return;
}

Assistant:

TEST(CharParsers, AnyOfChars) {
  constexpr auto parser = anyOfChars("axn2B");

  {
    StringPtr text = "a";
    Input input(text.begin(), text.end());
    Maybe<char> result = parser(input);
    KJ_IF_MAYBE(value, result) {
      EXPECT_EQ('a', *value);
    } else {
      ADD_FAILURE() << "Expected parse result, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }